

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmodule.c
# Opt level: O2

FT_Error af_property_get(FT_Module ft_module,char *property_name,void *value)

{
  int iVar1;
  AF_Script AVar2;
  FT_Error FVar3;
  FT_Int *val;
  AF_FaceGlobals globals;
  
  iVar1 = strcmp(property_name,"glyph-to-script-map");
  if (iVar1 == 0) {
    FVar3 = af_property_get_face_globals(*value,&globals,(AF_Module)ft_module);
    if (FVar3 == 0) {
      *(FT_UShort **)((long)value + 8) = globals->glyph_styles;
      return 0;
    }
    return FVar3;
  }
  iVar1 = strcmp(property_name,"fallback-script");
  if (iVar1 == 0) {
    AVar2 = af_style_classes[*(uint *)&ft_module[1].clazz]->script;
  }
  else {
    iVar1 = strcmp(property_name,"default-script");
    if (iVar1 != 0) {
      iVar1 = strcmp(property_name,"increase-x-height");
      if (iVar1 == 0) {
        FVar3 = af_property_get_face_globals(*value,&globals,(AF_Module)ft_module);
        if (FVar3 == 0) {
          *(FT_UInt *)((long)value + 8) = globals->increase_x_height;
          return 0;
        }
        return FVar3;
      }
      iVar1 = strcmp(property_name,"darkening-parameters");
      if (iVar1 != 0) {
        iVar1 = strcmp(property_name,"no-stem-darkening");
        if (iVar1 == 0) {
          *(undefined1 *)value = *(undefined1 *)&ft_module[1].library;
          return 0;
        }
        return 0xc;
      }
      *(undefined4 *)value = *(undefined4 *)((long)&ft_module[1].library + 4);
      *(undefined4 *)((long)value + 4) = *(undefined4 *)&ft_module[1].memory;
      *(undefined4 *)((long)value + 8) = *(undefined4 *)((long)&ft_module[1].memory + 4);
      *(undefined4 *)((long)value + 0xc) = *(undefined4 *)&ft_module[2].clazz;
      *(undefined4 *)((long)value + 0x10) = *(undefined4 *)((long)&ft_module[2].clazz + 4);
      *(undefined4 *)((long)value + 0x14) = *(undefined4 *)&ft_module[2].library;
      *(undefined4 *)((long)value + 0x18) = *(undefined4 *)((long)&ft_module[2].library + 4);
      *(undefined4 *)((long)value + 0x1c) = *(undefined4 *)&ft_module[2].memory;
      return 0;
    }
    AVar2 = *(AF_Script *)((long)&ft_module[1].clazz + 4);
  }
  *(AF_Script *)value = AVar2;
  return 0;
}

Assistant:

static FT_Error
  af_property_get( FT_Module    ft_module,
                   const char*  property_name,
                   void*        value )
  {
    FT_Error   error          = FT_Err_Ok;
    AF_Module  module         = (AF_Module)ft_module;


    if ( !ft_strcmp( property_name, "glyph-to-script-map" ) )
    {
      FT_Prop_GlyphToScriptMap*  prop = (FT_Prop_GlyphToScriptMap*)value;
      AF_FaceGlobals             globals;


      error = af_property_get_face_globals( prop->face, &globals, module );
      if ( !error )
        prop->map = globals->glyph_styles;

      return error;
    }
    else if ( !ft_strcmp( property_name, "fallback-script" ) )
    {
      AF_Script*  val = (AF_Script*)value;

      AF_StyleClass  style_class = af_style_classes[module->fallback_style];


      *val = style_class->script;

      return error;
    }
    else if ( !ft_strcmp( property_name, "default-script" ) )
    {
      AF_Script*  val = (AF_Script*)value;


      *val = module->default_script;

      return error;
    }
    else if ( !ft_strcmp( property_name, "increase-x-height" ) )
    {
      FT_Prop_IncreaseXHeight*  prop = (FT_Prop_IncreaseXHeight*)value;
      AF_FaceGlobals            globals;


      error = af_property_get_face_globals( prop->face, &globals, module );
      if ( !error )
        prop->limit = globals->increase_x_height;

      return error;
    }
    else if ( !ft_strcmp( property_name, "darkening-parameters" ) )
    {
      FT_Int*  darken_params = module->darken_params;
      FT_Int*  val           = (FT_Int*)value;


      val[0] = darken_params[0];
      val[1] = darken_params[1];
      val[2] = darken_params[2];
      val[3] = darken_params[3];
      val[4] = darken_params[4];
      val[5] = darken_params[5];
      val[6] = darken_params[6];
      val[7] = darken_params[7];

      return error;
    }
    else if ( !ft_strcmp( property_name, "no-stem-darkening" ) )
    {
      FT_Bool   no_stem_darkening = module->no_stem_darkening;
      FT_Bool*  val               = (FT_Bool*)value;


      *val = no_stem_darkening;

      return error;
    }

    FT_TRACE2(( "af_property_get: missing property `%s'\n",
                property_name ));
    return FT_THROW( Missing_Property );
  }